

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O0

int LoadEXRMultipartImageFromMemory
              (EXRImage *exr_images,EXRHeader **exr_headers,uint num_parts,uchar *memory,char **err)

{
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *pvVar1;
  reference pvVar2;
  allocator_type *paVar3;
  long in_RCX;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  undefined8 *in_R8;
  int ret;
  uint part_no;
  uchar *part_number_addr;
  size_t c_1;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *offset_table_1;
  size_t i_2;
  unsigned_long_long offset;
  size_t c;
  uchar *in_stack_00000088;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_00000090;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> offset_table;
  size_t i_1;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  chunk_offset_table_list;
  char *marker;
  uint i;
  size_t total_header_size;
  value_type *in_stack_fffffffffffffef8;
  long lVar4;
  allocator_type *in_stack_ffffffffffffff00;
  value_type in_stack_ffffffffffffff08;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *in_stack_ffffffffffffff10;
  uint local_cc;
  uint *local_c8;
  allocator_type *local_c0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_b8;
  ulong local_b0;
  unsigned_long_long local_a8;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *local_a0;
  vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> local_80;
  ulong local_68;
  vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
  local_60;
  unsigned_long_long *local_48;
  uint local_3c;
  long local_38;
  long local_28;
  uint local_1c;
  int local_4;
  
  if ((((in_RDI == 0) || (in_RSI == 0)) || (in_EDX == 0)) || (in_RCX == 0)) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "Invalid argument.";
    }
    local_4 = -3;
  }
  else {
    local_38 = 0;
    for (local_3c = 0; local_3c < in_EDX; local_3c = local_3c + 1) {
      if (*(int *)(*(long *)(in_RSI + (ulong)local_3c * 8) + 0x58) == 0) {
        if (in_R8 != (undefined8 *)0x0) {
          *in_R8 = "EXRHeader is not initialized.";
        }
        return -3;
      }
      local_38 = (ulong)*(uint *)(*(long *)(in_RSI + (ulong)local_3c * 8) + 0x58) + local_38;
    }
    local_48 = (unsigned_long_long *)(in_RCX + local_38 + 9);
    local_28 = in_RCX;
    local_1c = in_EDX;
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
              *)0x1611a4);
    for (local_68 = 0; local_68 < local_1c; local_68 = local_68 + 1) {
      std::allocator<unsigned_long_long>::allocator((allocator<unsigned_long_long> *)0x1611f7);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
                (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      std::allocator<unsigned_long_long>::~allocator((allocator<unsigned_long_long> *)0x16121d);
      local_a0 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x0;
      while (in_stack_ffffffffffffff10 = local_a0,
            pvVar1 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                     std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                               (&local_80), in_stack_ffffffffffffff10 < pvVar1) {
        local_a8 = *local_48;
        tinyexr::swap8(&local_a8);
        in_stack_ffffffffffffff08 = local_a8 + 4;
        pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (&local_80,(size_type)local_a0);
        *pvVar2 = in_stack_ffffffffffffff08;
        local_48 = local_48 + 1;
        local_a0 = (vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                   ((long)&(local_a0->
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           )._M_impl.super__Vector_impl_data._M_start + 1);
      }
      std::
      vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
      ::push_back((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                   *)in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
      std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::~vector
                ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                 in_stack_ffffffffffffff00);
    }
    for (local_b0 = 0; local_b0 < local_1c; local_b0 = local_b0 + 1) {
      local_b8 = std::
                 vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
                 ::operator[](&local_60,local_b0);
      local_c0 = (allocator_type *)0x0;
      while (in_stack_ffffffffffffff00 = local_c0,
            paVar3 = (allocator_type *)
                     std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::size
                               (local_b8), in_stack_ffffffffffffff00 < paVar3) {
        lVar4 = local_28;
        pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::operator[]
                           (local_b8,(size_type)local_c0);
        local_c8 = (uint *)(lVar4 + -4 + *pvVar2);
        local_cc = *local_c8;
        tinyexr::swap4(&local_cc);
        if (local_cc != local_b0) {
          local_4 = -4;
          goto LAB_001614c5;
        }
        local_c0 = local_c0 + 1;
      }
      local_4 = tinyexr::DecodeChunk
                          ((EXRImage *)
                           offset_table.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (EXRHeader *)
                           offset_table.
                           super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>
                           ._M_impl.super__Vector_impl_data._M_start,in_stack_00000090,
                           in_stack_00000088);
      if (local_4 != 0) goto LAB_001614c5;
    }
    local_4 = 0;
LAB_001614c5:
    std::
    vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
    ::~vector((vector<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>,_std::allocator<std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>_>_>
               *)in_stack_ffffffffffffff00);
  }
  return local_4;
}

Assistant:

int LoadEXRMultipartImageFromMemory(EXRImage *exr_images,
                                    const EXRHeader **exr_headers,
                                    unsigned int num_parts,
                                    const unsigned char *memory,
                                    const char **err) {
  if (exr_images == NULL || exr_headers == NULL || num_parts == 0 ||
      memory == NULL) {
    if (err) {
      (*err) = "Invalid argument.";
    }
    return TINYEXR_ERROR_INVALID_ARGUMENT;
  }

  // compute total header size.
  size_t total_header_size = 0;
  for (unsigned int i = 0; i < num_parts; i++) {
    if (exr_headers[i]->header_len == 0) {
      if (err) {
        (*err) = "EXRHeader is not initialized.";
      }
      return TINYEXR_ERROR_INVALID_ARGUMENT;
    }

    total_header_size += exr_headers[i]->header_len;
  }

  const char *marker = reinterpret_cast<const char *>(
      memory + total_header_size + 4 +
      4);  // +8 for magic number and version header.

  marker += 1;  // Skip empty header.

  // NOTE 1:
  //   In multipart image, There is 'part number' before chunk data.
  //   4 byte : part number
  //   4+     : chunk
  //
  // NOTE 2:
  //   EXR spec says 'part number' is 'unsigned long' but actually this is
  //   'unsigned int(4 bytes)' in OpenEXR implementation...
  //   http://www.openexr.com/openexrfilelayout.pdf

  // Load chunk offset table.
  std::vector<std::vector<unsigned long long> > chunk_offset_table_list;
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> offset_table(
        static_cast<size_t>(exr_headers[i]->chunk_count));

    for (size_t c = 0; c < offset_table.size(); c++) {
      unsigned long long offset;
      memcpy(&offset, marker, 8);
      tinyexr::swap8(&offset);

      offset_table[c] = offset + 4;  // +4 to skip 'part number'
      marker += 8;
    }

    chunk_offset_table_list.push_back(offset_table);
  }

  // Decode image.
  for (size_t i = 0; i < static_cast<size_t>(num_parts); i++) {
    std::vector<unsigned long long> &offset_table = chunk_offset_table_list[i];

    // First check 'part number' is identitical to 'i'
    for (size_t c = 0; c < offset_table.size(); c++) {
      const unsigned char *part_number_addr =
          memory + offset_table[c] - 4;  // -4 to move to 'part number' field.
      unsigned int part_no;
      memcpy(&part_no, part_number_addr, sizeof(unsigned int));  // 4
      tinyexr::swap4(&part_no);

      if (part_no != i) {
        assert(0);
        return TINYEXR_ERROR_INVALID_DATA;
      }
    }

    int ret = tinyexr::DecodeChunk(&exr_images[i], exr_headers[i], offset_table,
                                   memory);
    if (ret != TINYEXR_SUCCESS) {
      return ret;
    }
  }

  return TINYEXR_SUCCESS;
}